

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcBoundedCurve::IfcBoundedCurve(IfcBoundedCurve *this,void **vtt)

{
  void **vtt_local;
  IfcBoundedCurve *this_local;
  
  IfcCurve::IfcCurve(&this->super_IfcCurve,vtt + 1);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcBoundedCurve,_0UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcBoundedCurve,_0UL> *)
             &(this->super_IfcCurve).super_IfcGeometricRepresentationItem.field_0x30,vtt + 0x10);
  (this->super_IfcCurve).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)*vtt;
  *(void **)((long)&(this->super_IfcCurve).super_IfcGeometricRepresentationItem.
                    super_IfcRepresentationItem.
                    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                    _vptr_ObjectHelper +
            (long)(this->super_IfcCurve).super_IfcGeometricRepresentationItem.
                  super_IfcRepresentationItem.
                  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                  _vptr_ObjectHelper[-3]) = vtt[0x12];
  *(void **)&(this->super_IfcCurve).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem
             .super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 =
       vtt[0x13];
  *(void **)&(this->super_IfcCurve).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem
             .super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 =
       vtt[0x14];
  *(void **)&(this->super_IfcCurve).super_IfcGeometricRepresentationItem.field_0x30 = vtt[0x15];
  return;
}

Assistant:

IfcBoundedCurve() : Object("IfcBoundedCurve") {}